

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int64_t motion_mode_rd(AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,BLOCK_SIZE bsize,
                      RD_STATS *rd_stats,RD_STATS *rd_stats_y,RD_STATS *rd_stats_uv,
                      HandleInterModeArgs *args,int64_t ref_best_rd,int64_t *ref_skip_rd,
                      int *rate_mv,BUFFER_SET *orig_dst,int64_t *best_est_rd,int do_tx_search,
                      InterModesInfo *inter_modes_info,int eval_motion_mode,int64_t *yrd)

{
  uint8_t uVar1;
  char cVar2;
  char cVar3;
  BLOCK_SIZE BVar4;
  InterpFilter interp_filter;
  uint32_t uVar5;
  int iVar6;
  SequenceHeader *pSVar7;
  MB_MODE_INFO *mbmi;
  long lVar8;
  InterModeRdModel *pIVar9;
  macroblockd_plane *pmVar10;
  int_mv *piVar11;
  WarpedMotionParams *pWVar12;
  TileDataEnc *pTVar13;
  undefined8 uVar14;
  byte bVar15;
  byte bVar16;
  MOTION_MODE MVar17;
  int iVar18;
  uint32_t uVar19;
  int iVar20;
  int64_t iVar21;
  ulong uVar22;
  void *pvVar23;
  int (*paiVar24) [3];
  BLOCK_SIZE *pBVar25;
  ulong uVar26;
  byte bVar27;
  MACROBLOCK *pMVar28;
  buf_2d *pbVar29;
  MACROBLOCK *pMVar30;
  uint uVar31;
  MACROBLOCK *pMVar32;
  long lVar33;
  int mode_index;
  uint uVar34;
  byte bVar35;
  long lVar36;
  size_t sVar37;
  bool bVar38;
  bool bVar39;
  double dVar40;
  uint local_ccc;
  int tmp_rate_mv;
  ulong local_cb8;
  long local_cb0;
  int tmp_rate2;
  MACROBLOCK *local_ca0;
  MACROBLOCK *local_c98;
  long local_c90;
  int local_c84;
  MACROBLOCK *local_c80;
  AV1_COMMON *local_c78;
  int local_c70;
  int local_c6c;
  int local_c68;
  int_interpfilters local_c64;
  uint local_c60;
  int local_c5c;
  uint local_c58;
  int local_c54;
  int_mv *local_c50;
  MACROBLOCK *local_c48;
  undefined4 local_c40;
  undefined3 uStack_c3c;
  double local_c38;
  ulong local_c30;
  int *local_c28;
  int *local_c20;
  MACROBLOCK *local_c18;
  ulong local_c10;
  ulong local_c08;
  ulong local_c00;
  ulong local_bf8;
  uint local_bf0;
  int_mv ref_mv;
  int64_t local_be8;
  WarpedMotionParams *local_be0;
  TileDataEnc *local_bd8;
  undefined8 local_bd0;
  ulong local_bc8;
  undefined4 *local_bc0;
  uint8_t *local_bb8;
  ulong local_bb0;
  WarpedMotionParams wm_params0;
  int64_t local_b38;
  int64_t iStack_b30;
  RD_STATS best_rd_stats_uv;
  RD_STATS best_rd_stats_y;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  int pts [16];
  int pts_inref [16];
  MB_MODE_INFO best_mbmi;
  MB_MODE_INFO base_mbmi;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  
  pSVar7 = (cpi->common).seq_params;
  uVar1 = pSVar7->monochrome;
  mbmi = *(x->e_mbd).mi;
  cVar2 = mbmi->ref_frame[1];
  bVar15 = mbmi->mode;
  local_cb8 = (ulong)bVar15;
  if (pSVar7->enable_interintra_compound == '\0') {
LAB_001f8c0f:
    bVar35 = 0;
  }
  else {
    bVar35 = 0;
    if ((0xf8 < (byte)(mbmi->bsize - BLOCK_32X64)) && (bVar35 = 0, 0xfb < (byte)(bVar15 - 0x11))) {
      if ('\0' < cVar2 || mbmi->ref_frame[0] < '\x01') goto LAB_001f8c0f;
      bVar35 = (mbmi->field_0xa8 & 2) >> 1;
    }
  }
  pMVar32 = (MACROBLOCK *)(ulong)(uVar1 == '\0');
  local_c78 = &cpi->common;
  local_c98 = (MACROBLOCK *)&x->e_mbd;
  local_c54 = rd_stats->rate;
  local_c58 = *rate_mv;
  cVar3 = mbmi->ref_frame[0];
  local_c20 = x->warp_sample_info[cVar3].pts;
  local_c28 = x->warp_sample_info[cVar3].pts_inref;
  mbmi->num_proj_ref = '\x01';
  local_be8 = 0x7fffffffffffffff;
  *yrd = 0x7fffffffffffffff;
  local_c30 = 1;
  local_c5c = 0;
  local_bd8 = tile_data;
  if (((cpi->common).features.switchable_motion_mode == true) &&
     (mbmi->overlappable_neighbors != '\0')) {
    iVar18 = (x->e_mbd).cur_frame_force_integer_mv;
    BVar4 = mbmi->bsize;
    if (iVar18 == 0) {
      bVar27 = block_size_high[BVar4];
      if (block_size_wide[BVar4] < block_size_high[BVar4]) {
        bVar27 = block_size_wide[BVar4];
      }
      if (((bVar15 == 0xf || bVar15 == 0x17) &&
          (1 < (x->e_mbd).global_motion[mbmi->ref_frame[0]].wmtype)) && (7 < bVar27))
      goto LAB_001f8e18;
    }
    else {
      bVar27 = block_size_high[BVar4];
      if (block_size_wide[BVar4] < block_size_high[BVar4]) {
        bVar27 = block_size_wide[BVar4];
      }
    }
    bVar16 = 0;
    if ((bVar27 < 8) || ((byte)(bVar15 - 0x19) < 0xf4)) goto LAB_001f8e20;
    if (mbmi->ref_frame[1] < '\0') {
      bVar16 = 1;
      if (((cpi->common).features.allow_warped_motion != false && iVar18 == 0) &&
         (iVar18 = av1_is_scaled((x->e_mbd).block_ref_scale_factors[0]), iVar18 == 0)) {
        uVar31 = x->warp_sample_info[cVar3].num;
        uVar26 = (ulong)uVar31;
        if ((int)uVar31 < 0) {
          bVar15 = av1_findSamples(local_c78,(MACROBLOCKD *)local_c98,local_c20,local_c28);
          uVar26 = (ulong)bVar15;
          x->warp_sample_info[cVar3].num = (uint)bVar15;
        }
        mbmi->num_proj_ref = (uint8_t)uVar26;
        local_c30 = uVar26 & 0xff;
        bVar16 = 2 - ((uint8_t)uVar26 == '\0');
      }
      goto LAB_001f8e20;
    }
  }
LAB_001f8e18:
  bVar16 = 0;
LAB_001f8e20:
  local_bb0 = (ulong)bVar35;
  local_ca0 = (MACROBLOCK *)rd_stats_y;
  memcpy(&base_mbmi,mbmi,0xb0);
  pMVar28 = local_c98;
  interp_filter = (cpi->common).features.interp_filter;
  iVar18 = av1_is_interp_needed((MACROBLOCKD *)local_c98);
  if (iVar18 != 0) {
    local_c5c = av1_get_switchable_rate
                          (x,(MACROBLOCKD *)pMVar28,interp_filter,
                           (uint)((cpi->common).seq_params)->enable_dual_filter);
  }
  pTVar13 = local_bd8;
  local_bf0 = (uint)(uVar1 == '\0') * 2;
  local_c10 = (ulong)(local_bf0 + 1);
  local_bf8 = (ulong)bVar16;
  uVar31 = (uint)bVar16 + (int)local_bb0;
  bVar38 = eval_motion_mode != 0;
  uVar26 = 0;
  if (!bVar38) {
    uVar26 = (ulong)((uint)(0xc3fe00L >> (bsize & 0x3f)) & 4);
  }
  pMVar28 = (MACROBLOCK *)(ulong)bsize;
  local_ccc = uVar31;
  if (!bVar38) {
    local_ccc = 0;
  }
  bVar39 = (cpi->sf).winner_mode_sf.motion_mode_for_winner_cand != 0;
  if (!bVar39) {
    local_ccc = uVar31;
  }
  if (((cpi->sf).inter_sf.extra_prune_warped != 0) && (BLOCK_16X16 < mbmi->bsize)) {
    local_ccc = 0;
  }
  local_c48 = (MACROBLOCK *)ref_best_rd;
  local_c00 = (ulong)(uint)(x->e_mbd).mi_row;
  local_c08 = (ulong)(uint)(x->e_mbd).mi_col;
  local_c84 = *(int *)((long)(cpi->sf).inter_sf.txfm_rd_gate_level + uVar26);
  uVar34 = (uint)(bVar39 && bVar38);
  uVar31 = (uint)interp_filter;
  if (interp_filter == MULTITAP_SHARP2) {
    uVar31 = 0;
  }
  local_c64.as_int = uVar31 * 0x10001;
  pMVar30 = (MACROBLOCK *)(ulong)local_c58;
  local_c70 = local_c54 - local_c58;
  pIVar9 = local_bd8->inter_mode_rd_models;
  local_b38 = 0x7fffffffffffffff;
  iStack_b30 = 0x7fffffffffffffff;
  local_be0 = &mbmi->wm_params;
  uVar26 = (ulong)(uint)((int)local_c30 * 8);
  local_c50 = mbmi->mv;
  local_c18 = (MACROBLOCK *)(x->mode_costs).skip_txfm_cost;
  local_bc0 = (undefined4 *)&rd_stats->field_0x21;
  local_bb8 = (x->txfm_search_info).blk_skip;
  local_c6c = 0x7fffffff;
  local_bc8 = 0;
  local_c90 = 0x7fffffffffffffff;
  local_c68 = 0;
  local_c60 = local_c58;
  local_cb0 = 0x7fffffffffffffff;
  local_bd0 = 0;
  do {
    if (local_ccc < uVar34) {
      mbmi->ref_frame[1] = cVar2;
      *rate_mv = local_c60;
      if ((local_cb0 == 0x7fffffffffffffff) ||
         (iVar18 = av1_check_newmv_joint_nonzero((AV1_COMMON *)x,pMVar30), iVar18 == 0)) {
        rd_stats->rate = 0x7fffffff;
        rd_stats->zero_rate = 0;
        rd_stats->dist = 0x7fffffffffffffff;
        rd_stats->rdcost = 0x7fffffffffffffff;
        rd_stats->sse = 0x7fffffffffffffff;
        rd_stats->skip_txfm = '\0';
        ms_params.mv_limits._8_8_ = *(undefined8 *)(orig_dst->stride + 2);
        ms_params._16_8_ = orig_dst->plane[2];
        ms_params.mv_limits.col_min = orig_dst->stride[0];
        ms_params.mv_limits.col_max = orig_dst->stride[1];
        ms_params._0_8_ = orig_dst->plane[0];
        ms_params.cost_list = (int *)orig_dst->plane[1];
        pmVar10 = (x->e_mbd).plane;
        for (uVar26 = 0; pbVar29 = &pmVar10->dst, (local_c10 & 0xffffffff) != uVar26;
            uVar26 = uVar26 + 1) {
          pbVar29->buf = (uint8_t *)ms_params.mv_cost_params.mvcost[uVar26 - 8];
          pbVar29->stride = *(int *)((long)ms_params.mv_cost_params.mvcost + uVar26 * 4 + -0x28);
          pmVar10 = (macroblockd_plane *)(pbVar29 + 0x51);
        }
      }
      else {
        memcpy(mbmi,&best_mbmi,0xb0);
        rd_stats->rate = local_c6c;
        rd_stats->zero_rate = local_c68;
        rd_stats->dist = local_c90;
        rd_stats->rdcost = local_b38;
        rd_stats->sse = iStack_b30;
        rd_stats->skip_txfm = (uint8_t)local_bc8;
        *(uint *)((long)local_bc0 + 3) = CONCAT31(uStack_c3c,local_c40._3_1_);
        *local_bc0 = local_c40;
        local_ca0->plane[0].src_diff = (int16_t *)best_rd_stats_y._0_8_;
        *(int64_t *)&local_ca0->plane[0].dqcoeff = best_rd_stats_y.dist;
        local_ca0->plane[0].qcoeff = (tran_low_t *)best_rd_stats_y.rdcost;
        local_ca0->plane[0].coeff = (tran_low_t *)best_rd_stats_y.sse;
        local_ca0->plane[0].eobs = (uint16_t *)best_rd_stats_y._32_8_;
        if (uVar1 == '\0') {
          rd_stats_uv->skip_txfm = best_rd_stats_uv.skip_txfm;
          *(undefined7 *)&rd_stats_uv->field_0x21 = best_rd_stats_uv._33_7_;
          rd_stats_uv->rdcost = best_rd_stats_uv.rdcost;
          rd_stats_uv->sse = best_rd_stats_uv.sse;
          rd_stats_uv->rate = best_rd_stats_uv.rate;
          rd_stats_uv->zero_rate = best_rd_stats_uv.zero_rate;
          rd_stats_uv->dist = best_rd_stats_uv.dist;
        }
        sVar37 = (ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height;
        memcpy(local_bb8,best_blk_skip,sVar37);
        memcpy((x->e_mbd).tx_type_map,best_tx_type_map,sVar37);
        (x->txfm_search_info).skip_txfm = (uint8_t)local_bd0;
        ms_params.mv_limits._8_8_ = *(undefined8 *)(orig_dst->stride + 2);
        ms_params._16_8_ = orig_dst->plane[2];
        ms_params.mv_limits.col_min = orig_dst->stride[0];
        ms_params.mv_limits.col_max = orig_dst->stride[1];
        ms_params._0_8_ = orig_dst->plane[0];
        ms_params.cost_list = (int *)orig_dst->plane[1];
        pmVar10 = (x->e_mbd).plane;
        for (uVar26 = 0; pbVar29 = &pmVar10->dst, (local_c10 & 0xffffffff) != uVar26;
            uVar26 = uVar26 + 1) {
          pbVar29->buf = (uint8_t *)ms_params.mv_cost_params.mvcost[uVar26 - 8];
          pbVar29->stride = *(int *)((long)ms_params.mv_cost_params.mvcost + uVar26 * 4 + -0x28);
          pmVar10 = (macroblockd_plane *)(pbVar29 + 0x51);
        }
        local_be8 = 0;
      }
      return local_be8;
    }
    if ((uVar34 == 0) || (args->skip_motion_mode == 0)) {
      tmp_rate2 = local_c54;
      tmp_rate_mv = local_c58;
      memcpy(mbmi,&base_mbmi,0xb0);
      piVar11 = local_c50;
      MVar17 = (MOTION_MODE)uVar34;
      if ((uint)local_bf8 < uVar34) {
        MVar17 = '\0';
      }
      mbmi->motion_mode = MVar17;
      pMVar30 = pMVar28;
      if (((byte)((cpi->oxcf).motion_mode_cfg.enable_obmc ^ 1U |
                 (cpi->ppi->frame_probs).obmc_probs
                 [(cpi->ppi->gf_group).update_type[cpi->gf_frame_index]][(long)pMVar28] <
                 (cpi->sf).inter_sf.prune_obmc_prob_thresh) != 1) || (MVar17 != '\x01')) {
        if (((uint)local_bf8 < uVar34) || (MVar17 != '\0')) {
          if (MVar17 == '\x02') {
            mbmi->motion_mode = '\x02';
            (mbmi->wm_params).wmtype = '\x03';
            (mbmi->interp_filters).as_int = (uint32_t)local_c64;
            pMVar30 = (MACROBLOCK *)pts;
            memcpy(pMVar30,local_c20,uVar26);
            memcpy(pts_inref,local_c28,uVar26);
            bVar15 = mbmi->num_proj_ref;
            if (1 < bVar15) {
              bVar15 = av1_selectSamples(&local_c50->as_mv,(int *)pMVar30,pts_inref,(uint)bVar15,
                                         bsize);
              mbmi->num_proj_ref = bVar15;
            }
            pWVar12 = local_be0;
            uVar31 = (uint)mbmi->mv[0].as_mv.col;
            pMVar32 = (MACROBLOCK *)(ulong)uVar31;
            iVar18 = av1_find_projection((uint)bVar15,(int *)pMVar30,pts_inref,bsize,
                                         (int)mbmi->mv[0].as_mv.row,uVar31,local_be0,(int)local_c00,
                                         (int)local_c08);
            if (iVar18 != 0) goto LAB_001f9d25;
            if (((byte)local_cb8 < 0x19) && ((0x1790000U >> ((uint)local_cb8 & 0x1f) & 1) != 0)) {
              local_c80 = (MACROBLOCK *)CONCAT44(local_c80._4_4_,mbmi->mv[0].as_int);
              wm_params0.wmtype = pWVar12->wmtype;
              wm_params0.invalid = pWVar12->invalid;
              wm_params0._34_2_ = *(undefined2 *)&pWVar12->field_0x22;
              wm_params0.wmmat._0_8_ = *(undefined8 *)pWVar12->wmmat;
              wm_params0.wmmat._8_8_ = *(undefined8 *)(pWVar12->wmmat + 2);
              wm_params0.wmmat._16_8_ = *(undefined8 *)(pWVar12->wmmat + 4);
              wm_params0.alpha = pWVar12->alpha;
              wm_params0.beta = pWVar12->beta;
              wm_params0.gamma = pWVar12->gamma;
              wm_params0.delta = pWVar12->delta;
              local_c38 = (double)CONCAT71(local_c38._1_7_,mbmi->num_proj_ref);
              ref_mv = av1_get_ref_mv(x,0);
              av1_make_default_subpel_ms_params(&ms_params,cpi,x,bsize,&ref_mv.as_mv,(int *)0x0);
              av1_refine_warped_mv
                        ((MACROBLOCKD *)local_c98,local_c78,&ms_params,bsize,local_c20,local_c28,
                         (int)local_c30,(cpi->sf).mv_sf.warp_search_method,
                         (cpi->sf).mv_sf.warp_search_iters);
              if ((uint32_t)local_c80 == mbmi->mv[0].as_int) {
                local_be0->wmtype = wm_params0.wmtype;
                local_be0->invalid = wm_params0.invalid;
                *(undefined2 *)&local_be0->field_0x22 = wm_params0._34_2_;
                *(undefined8 *)(local_be0->wmmat + 4) = wm_params0.wmmat._16_8_;
                local_be0->alpha = wm_params0.alpha;
                local_be0->beta = wm_params0.beta;
                local_be0->gamma = wm_params0.gamma;
                local_be0->delta = wm_params0.delta;
                *(undefined8 *)local_be0->wmmat = wm_params0.wmmat._0_8_;
                *(undefined8 *)(local_be0->wmmat + 2) = wm_params0.wmmat._8_8_;
                mbmi->num_proj_ref = local_c38._0_1_;
              }
              else {
                tmp_rate_mv = av1_mv_bit_cost((MV *)local_c50,&ref_mv.as_mv,
                                              x->mv_costs->nmv_joint_cost,x->mv_costs->mv_cost_stack
                                              ,0x6c);
                tmp_rate2 = tmp_rate_mv + local_c70;
              }
            }
            pMVar30 = local_c98;
            pMVar32 = pMVar28;
            av1_enc_build_inter_predictor
                      (local_c78,(MACROBLOCKD *)local_c98,(int)local_c00,(int)local_c08,
                       (BUFFER_SET *)0x0,bsize,0,
                       (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2);
          }
          else if (MVar17 == '\x01') {
            uVar5 = local_c50->as_int;
            uVar19 = uVar5;
            if (((uint)local_cb8 < 0x19) && ((0x1790000U >> ((uint)local_cb8 & 0x1f) & 1) != 0)) {
              av1_single_motion_search
                        (cpi,x,bsize,0,&tmp_rate_mv,0x7fffffff,(inter_mode_info *)0x0,local_c50,
                         (HandleInterModeArgs *)0x0);
              tmp_rate2 = tmp_rate_mv + local_c70;
              uVar19 = piVar11->as_int;
            }
            pMVar30 = local_c98;
            if ((eval_motion_mode != 0) || (uVar19 != uVar5)) {
              av1_enc_build_inter_predictor
                        (local_c78,(MACROBLOCKD *)local_c98,(int)local_c00,(int)local_c08,orig_dst,
                         bsize,0,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2);
            }
            pMVar32 = (MACROBLOCK *)args->left_pred_stride;
            av1_build_obmc_inter_prediction
                      (local_c78,(MACROBLOCKD *)pMVar30,args->above_pred_buf,args->above_pred_stride
                       ,args->left_pred_buf,args->left_pred_stride);
          }
          else if (((uint)local_bf8 < uVar34) &&
                  (pMVar30 = x, pMVar32 = local_c48,
                  iVar18 = av1_handle_inter_intra_mode
                                     (cpi,x,bsize,mbmi,args,(int64_t)local_c48,&tmp_rate_mv,
                                      &tmp_rate2,orig_dst), iVar18 < 0)) goto LAB_001f9d25;
        }
        iVar18 = av1_check_newmv_joint_nonzero((AV1_COMMON *)x,pMVar30);
        if (iVar18 != 0) {
          (x->txfm_search_info).skip_txfm = '\0';
          rd_stats->dist = 0;
          rd_stats->sse = 0;
          rd_stats->skip_txfm = '\x01';
          rd_stats->rate = tmp_rate2;
          bVar15 = mbmi->motion_mode;
          iVar18 = tmp_rate2;
          if ((ulong)bVar15 != 2) {
            iVar18 = tmp_rate2 + local_c5c;
            rd_stats->rate = iVar18;
          }
          if ((int)local_bb0 != 0) {
            iVar18 = iVar18 + (x->mode_costs).interintra_cost
                              [(byte)pMVar28[0x1d].search_site_cfg_buf[4].site[8][9].offset]
                              [mbmi->ref_frame[1] == '\0'];
            rd_stats->rate = iVar18;
          }
          if ((bVar16 != 0) && (mbmi->ref_frame[1] != '\0')) {
            paiVar24 = (x->mode_costs).motion_mode_cost + (long)pMVar28;
            if (bVar16 != 2) {
              paiVar24 = (int (*) [3])((x->mode_costs).motion_mode_cost1 + (long)pMVar28);
            }
            iVar18 = iVar18 + (*paiVar24)[bVar15];
            rd_stats->rate = iVar18;
          }
          if (do_tx_search == 0) {
            ms_params.allow_hp = -1;
            ms_params._4_4_ = 0xffffffff;
            pts[0] = -1;
            pts[1] = -1;
            wm_params0.wmmat._0_8_ = wm_params0.wmmat._0_8_ & 0xffffffff00000000;
            pts_inref[0] = 0;
            pts_inref[1] = 0;
            iVar18 = (cpi->sf).inter_sf.inter_mode_rd_model_estimation;
            if (iVar18 == 2) {
LAB_001f984f:
              pMVar32 = (MACROBLOCK *)(ulong)local_bf0;
              model_rd_for_sb_with_curvfit
                        (cpi,bsize,x,(MACROBLOCKD *)local_c98,0,local_bf0,wm_params0.wmmat,
                         (int64_t *)pts_inref,(uint8_t *)0x0,(int64_t *)&ms_params,(int *)0x0,
                         (int64_t *)0x0,(int64_t *)0x0);
              pts[0] = (int)(ulong)x->pred_sse[(*(x->e_mbd).mi)->ref_frame[0]];
              pts[1] = (int)((ulong)x->pred_sse[(*(x->e_mbd).mi)->ref_frame[0]] >> 0x20);
              lVar33 = pts_inref._0_8_;
              iVar18 = wm_params0.wmmat[0];
            }
            else if (iVar18 == 1) {
              iVar21 = get_sse(cpi,x,(int64_t *)pts);
              iVar18 = 0;
              ms_params._0_8_ = iVar21;
              if (pIVar9[(long)pMVar28].ready == 0) {
                lVar33 = 0;
              }
              else {
                dVar40 = pTVar13->inter_mode_rd_models[(long)pMVar28].dist_mean;
                lVar33 = iVar21;
                if (dVar40 <= (double)iVar21) {
                  local_c80 = (MACROBLOCK *)(double)iVar21;
                  local_c38 = dVar40;
                  dVar40 = round(dVar40);
                  lVar33 = (long)dVar40;
                  dVar40 = pTVar13->inter_mode_rd_models[(long)pMVar28].a * (double)local_c80 +
                           pTVar13->inter_mode_rd_models[(long)pMVar28].b;
                  iVar18 = 0x3fffffff;
                  if (0.01 <= ABS(dVar40)) {
                    dVar40 = ((double)local_c80 - local_c38) / dVar40;
                    if (0.0 <= dVar40) {
                      dVar40 = round(dVar40);
                      if ((0x3ffffffe < (long)dVar40) || (iVar18 = (int)(long)dVar40, 0 < iVar18))
                      goto LAB_001f9a31;
                    }
                    wm_params0.wmmat._0_8_ = wm_params0.wmmat._0_8_ & 0xffffffff00000000;
                    goto LAB_001f99d4;
                  }
                }
              }
            }
            else {
              if ((cpi->sf).rt_sf.use_nonrd_pick_mode != 0) goto LAB_001f984f;
              iVar21 = 0;
LAB_001f99d4:
              lVar33 = iVar21;
              iVar18 = 0;
            }
LAB_001f9a31:
            iVar20 = rd_stats->rate;
            pMVar30 = (MACROBLOCK *)(long)iVar20;
            pBVar25 = (BLOCK_SIZE *)((long)&pMVar30->plane[0].src_diff + (long)iVar18);
            iVar18 = x->rdmult;
            lVar36 = lVar33 * 0x80 + ((long)pBVar25 * (long)iVar18 + 0x100 >> 9);
            if ((double)lVar36 * 0.8 <= (double)*best_est_rd) {
              rd_stats->rate = (int)pBVar25;
              rd_stats->dist = lVar33;
              rd_stats->rdcost = lVar36;
              if (lVar36 < *best_est_rd) {
                *best_est_rd = lVar36;
                lVar33 = 0x7fffffffffffffff;
                if (local_c84 != 0) {
                  lVar33 = pts._0_8_ * 0x800 + ((long)iVar18 * (long)pMVar30 + 0x100 >> 9);
                }
                ref_skip_rd[1] = lVar33;
              }
              if (((cpi->common).current_frame.reference_mode != '\0') || (cVar2 < '\x01')) {
                pMVar32 = local_ca0;
                inter_modes_info_push
                          (inter_modes_info,iVar20,ms_params._0_8_,rd_stats->rdcost,rd_stats,
                           (RD_STATS *)local_ca0,rd_stats_uv,mbmi);
              }
              mbmi->skip_txfm = '\0';
              local_c80 = (MACROBLOCK *)0x7fffffffffffffff;
              goto LAB_001f9b29;
            }
            mbmi->ref_frame[1] = cVar2;
          }
          else {
            lVar33 = 0x7fffffffffffffff;
            lVar36 = 0x7fffffffffffffff;
            if (local_c84 != 0) {
              ms_params.allow_hp = -1;
              ms_params._4_4_ = 0x7fffffff;
              iVar21 = get_sse(cpi,x,(int64_t *)&ms_params);
              uVar14 = ms_params._0_8_;
              iVar18 = rd_stats->rate;
              lVar33 = (long)x->rdmult * (long)iVar18 + 0x100 >> 9;
              lVar36 = iVar21 * 0x80 + lVar33;
              pMVar30 = pMVar28;
              iVar20 = check_txfm_eval(x,bsize,*ref_skip_rd,lVar36,local_c84,(int)pMVar32);
              if (iVar20 == 0) goto LAB_001f9d25;
              lVar33 = lVar33 + uVar14 * 0x800;
            }
            pMVar30 = x;
            pMVar32 = (MACROBLOCK *)rd_stats_uv;
            iVar20 = av1_txfm_search(cpi,x,bsize,rd_stats,(RD_STATS *)local_ca0,rd_stats_uv,iVar18,
                                     (int64_t)local_c48);
            if (iVar20 == 0) {
              if ((uVar34 == 0) && (*(int *)&local_ca0->plane[0].src_diff == 0x7fffffff)) {
                return local_be8;
              }
            }
            else {
              uVar31 = av1_get_skip_txfm_context((MACROBLOCKD *)local_c98);
              uVar22 = (ulong)uVar31;
              if (rd_stats->skip_txfm == '\0') {
                iVar20 = *(int *)(&local_c18->plane[0].src_diff + uVar22) +
                         *(int *)&local_ca0->plane[0].src_diff;
              }
              else {
                iVar20 = *(int *)((long)&local_c18->plane[0].src_diff + uVar22 * 8 + 4);
              }
              iVar6 = x->rdmult;
              lVar8 = *(long *)&local_ca0->plane[0].dqcoeff;
              pMVar30 = (MACROBLOCK *)
                        (rd_stats->dist * 0x80 + ((long)rd_stats->rate * (long)iVar6 + 0x100 >> 9));
              if ((long)pMVar30 < (long)local_c48) {
                *ref_skip_rd = lVar36;
                ref_skip_rd[1] = lVar33;
                local_c48 = pMVar30;
              }
              pMVar32 = (MACROBLOCK *)
                        (lVar8 * 0x80 + ((long)(iVar20 + iVar18) * (long)iVar6 + 0x100 >> 9));
              local_c80 = pMVar32;
              if ((cpi->sf).inter_sf.inter_mode_rd_model_estimation == 1) {
                pMVar30 = (MACROBLOCK *)(ulong)mbmi->bsize;
                pMVar32 = local_c18;
                inter_mode_data_push
                          (local_bd8,mbmi->bsize,rd_stats->sse,rd_stats->dist,
                           rd_stats_uv->rate + *(int *)&local_ca0->plane[0].src_diff +
                           *(int *)((long)&local_c18->plane[0].src_diff +
                                   (ulong)mbmi->skip_txfm * 4 + uVar22 * 8));
              }
LAB_001f9b29:
              if ((local_cb8 == 0x17) || ((uint)local_cb8 == 0xf)) {
                pMVar30 = (MACROBLOCK *)*(x->e_mbd).mi;
                iVar18 = is_nontrans_global_motion((MACROBLOCKD *)local_c98,(MB_MODE_INFO *)pMVar30)
                ;
                if (iVar18 != 0) {
                  mbmi->interp_filters = local_c64;
                }
              }
              iVar18 = rd_stats->rate;
              lVar33 = rd_stats->dist;
              lVar36 = lVar33 * 0x80 + ((long)x->rdmult * (long)iVar18 + 0x100 >> 9);
              if (uVar34 == 0) {
                *(long *)((long)args->simple_rd[local_cb8][0] +
                         (long)mbmi->ref_frame[0] * 8 +
                         (ulong)(*(ushort *)&mbmi->field_0xa7 & 0x30) * 4) = lVar36;
                lVar33 = rd_stats->dist;
              }
              else if (local_cb0 <= lVar36) goto LAB_001f9d25;
              local_cb0 = (long)iVar18;
              memcpy(&best_mbmi,mbmi,0xb0);
              local_c68 = rd_stats->zero_rate;
              local_b38 = rd_stats->rdcost;
              iStack_b30 = rd_stats->sse;
              local_bc8 = (ulong)CONCAT31((int3)((uint)local_c68 >> 8),rd_stats->skip_txfm);
              local_c40._0_3_ = (undefined3)*local_bc0;
              local_c40._3_1_ = (undefined1)*(undefined4 *)((long)local_bc0 + 3);
              uStack_c3c = (undefined3)((uint)*(undefined4 *)((long)local_bc0 + 3) >> 8);
              best_rd_stats_y._32_8_ = local_ca0->plane[0].eobs;
              best_rd_stats_y._0_8_ = local_ca0->plane[0].src_diff;
              best_rd_stats_y.dist = *(int64_t *)&local_ca0->plane[0].dqcoeff;
              best_rd_stats_y.rdcost = (int64_t)local_ca0->plane[0].qcoeff;
              best_rd_stats_y.sse = (int64_t)local_ca0->plane[0].coeff;
              local_c60 = tmp_rate_mv;
              *yrd = (int64_t)local_c80;
              if (uVar1 == '\0') {
                best_rd_stats_uv.skip_txfm = rd_stats_uv->skip_txfm;
                best_rd_stats_uv._33_7_ = *(undefined7 *)&rd_stats_uv->field_0x21;
                best_rd_stats_uv.rate = rd_stats_uv->rate;
                best_rd_stats_uv.zero_rate = rd_stats_uv->zero_rate;
                best_rd_stats_uv.dist = rd_stats_uv->dist;
                best_rd_stats_uv.rdcost = rd_stats_uv->rdcost;
                best_rd_stats_uv.sse = rd_stats_uv->sse;
              }
              sVar37 = (ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height;
              memcpy(best_blk_skip,local_bb8,sVar37);
              pMVar30 = (MACROBLOCK *)(x->e_mbd).tx_type_map;
              pvVar23 = memcpy(best_tx_type_map,pMVar30,sVar37);
              local_bd0 = CONCAT71((int7)((ulong)pvVar23 >> 8),mbmi->skip_txfm);
              local_c6c = (int)local_cb0;
              local_cb0 = lVar36;
              local_c90 = lVar33;
            }
          }
        }
      }
    }
LAB_001f9d25:
    uVar34 = uVar34 + 1;
  } while( true );
}

Assistant:

static int64_t motion_mode_rd(
    const AV1_COMP *const cpi, TileDataEnc *tile_data, MACROBLOCK *const x,
    BLOCK_SIZE bsize, RD_STATS *rd_stats, RD_STATS *rd_stats_y,
    RD_STATS *rd_stats_uv, HandleInterModeArgs *const args, int64_t ref_best_rd,
    int64_t *ref_skip_rd, int *rate_mv, const BUFFER_SET *orig_dst,
    int64_t *best_est_rd, int do_tx_search, InterModesInfo *inter_modes_info,
    int eval_motion_mode, int64_t *yrd) {
  const AV1_COMMON *const cm = &cpi->common;
  const FeatureFlags *const features = &cm->features;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const int is_comp_pred = has_second_ref(mbmi);
  const PREDICTION_MODE this_mode = mbmi->mode;
  const int rate2_nocoeff = rd_stats->rate;
  int best_xskip_txfm = 0;
  RD_STATS best_rd_stats, best_rd_stats_y, best_rd_stats_uv;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  const int rate_mv0 = *rate_mv;
  const int interintra_allowed = cm->seq_params->enable_interintra_compound &&
                                 is_interintra_allowed(mbmi) &&
                                 mbmi->compound_idx;
  WARP_SAMPLE_INFO *const warp_sample_info =
      &x->warp_sample_info[mbmi->ref_frame[0]];
  int *pts0 = warp_sample_info->pts;
  int *pts_inref0 = warp_sample_info->pts_inref;

  assert(mbmi->ref_frame[1] != INTRA_FRAME);
  const MV_REFERENCE_FRAME ref_frame_1 = mbmi->ref_frame[1];
  av1_invalid_rd_stats(&best_rd_stats);
  mbmi->num_proj_ref = 1;  // assume num_proj_ref >=1
  MOTION_MODE last_motion_mode_allowed = SIMPLE_TRANSLATION;
  *yrd = INT64_MAX;
  if (features->switchable_motion_mode) {
    // Determine which motion modes to search if more than SIMPLE_TRANSLATION
    // is allowed.
    last_motion_mode_allowed = motion_mode_allowed(
        xd->global_motion, xd, mbmi, features->allow_warped_motion);
  }

  if (last_motion_mode_allowed == WARPED_CAUSAL) {
    // Collect projection samples used in least squares approximation of
    // the warped motion parameters if WARPED_CAUSAL is going to be searched.
    if (warp_sample_info->num < 0) {
      warp_sample_info->num = av1_findSamples(cm, xd, pts0, pts_inref0);
    }
    mbmi->num_proj_ref = warp_sample_info->num;
  }
  const int total_samples = mbmi->num_proj_ref;
  if (total_samples == 0) {
    // Do not search WARPED_CAUSAL if there are no samples to use to determine
    // warped parameters.
    last_motion_mode_allowed = OBMC_CAUSAL;
  }

  const MB_MODE_INFO base_mbmi = *mbmi;
  MB_MODE_INFO best_mbmi;
  const int interp_filter = features->interp_filter;
  const int switchable_rate =
      av1_is_interp_needed(xd)
          ? av1_get_switchable_rate(x, xd, interp_filter,
                                    cm->seq_params->enable_dual_filter)
          : 0;
  int64_t best_rd = INT64_MAX;
  int best_rate_mv = rate_mv0;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  int mode_index_start, mode_index_end;
  const int txfm_rd_gate_level =
      get_txfm_rd_gate_level(cm->seq_params->enable_masked_compound,
                             cpi->sf.inter_sf.txfm_rd_gate_level, bsize,
                             TX_SEARCH_MOTION_MODE, eval_motion_mode);

  // Modify the start and end index according to speed features. For example,
  // if SIMPLE_TRANSLATION has already been searched according to
  // the motion_mode_for_winner_cand speed feature, update the mode_index_start
  // to avoid searching it again.
  update_mode_start_end_index(cpi, mbmi, &mode_index_start, &mode_index_end,
                              last_motion_mode_allowed, interintra_allowed,
                              eval_motion_mode);
  // Main function loop. This loops over all of the possible motion modes and
  // computes RD to determine the best one. This process includes computing
  // any necessary side information for the motion mode and performing the
  // transform search.
  for (int mode_index = mode_index_start; mode_index <= mode_index_end;
       mode_index++) {
    if (args->skip_motion_mode && mode_index) continue;
    int tmp_rate2 = rate2_nocoeff;
    const int is_interintra_mode = mode_index > (int)last_motion_mode_allowed;
    int tmp_rate_mv = rate_mv0;

    *mbmi = base_mbmi;
    if (is_interintra_mode) {
      // Only use SIMPLE_TRANSLATION for interintra
      mbmi->motion_mode = SIMPLE_TRANSLATION;
    } else {
      mbmi->motion_mode = (MOTION_MODE)mode_index;
      assert(mbmi->ref_frame[1] != INTRA_FRAME);
    }

    // Do not search OBMC if the probability of selecting it is below a
    // predetermined threshold for this update_type and block size.
    const FRAME_UPDATE_TYPE update_type =
        get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
    int use_actual_frame_probs = 1;
    int prune_obmc;
#if CONFIG_FPMT_TEST
    use_actual_frame_probs =
        (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) ? 0 : 1;
    if (!use_actual_frame_probs) {
      prune_obmc = cpi->ppi->temp_frame_probs.obmc_probs[update_type][bsize] <
                   cpi->sf.inter_sf.prune_obmc_prob_thresh;
    }
#endif
    if (use_actual_frame_probs) {
      prune_obmc = cpi->ppi->frame_probs.obmc_probs[update_type][bsize] <
                   cpi->sf.inter_sf.prune_obmc_prob_thresh;
    }
    if ((!cpi->oxcf.motion_mode_cfg.enable_obmc || prune_obmc) &&
        mbmi->motion_mode == OBMC_CAUSAL)
      continue;

    if (mbmi->motion_mode == SIMPLE_TRANSLATION && !is_interintra_mode) {
      // SIMPLE_TRANSLATION mode: no need to recalculate.
      // The prediction is calculated before motion_mode_rd() is called in
      // handle_inter_mode()
    } else if (mbmi->motion_mode == OBMC_CAUSAL) {
      const uint32_t cur_mv = mbmi->mv[0].as_int;
      // OBMC_CAUSAL not allowed for compound prediction
      assert(!is_comp_pred);
      if (have_newmv_in_inter_mode(this_mode)) {
        av1_single_motion_search(cpi, x, bsize, 0, &tmp_rate_mv, INT_MAX, NULL,
                                 &mbmi->mv[0], NULL);
        tmp_rate2 = rate2_nocoeff - rate_mv0 + tmp_rate_mv;
      }
      if ((mbmi->mv[0].as_int != cur_mv) || eval_motion_mode) {
        // Build the predictor according to the current motion vector if it has
        // not already been built
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                      0, av1_num_planes(cm) - 1);
      }
      // Build the inter predictor by blending the predictor corresponding to
      // this MV, and the neighboring blocks using the OBMC model
      av1_build_obmc_inter_prediction(
          cm, xd, args->above_pred_buf, args->above_pred_stride,
          args->left_pred_buf, args->left_pred_stride);
#if !CONFIG_REALTIME_ONLY
    } else if (mbmi->motion_mode == WARPED_CAUSAL) {
      int pts[SAMPLES_ARRAY_SIZE], pts_inref[SAMPLES_ARRAY_SIZE];
      mbmi->motion_mode = WARPED_CAUSAL;
      mbmi->wm_params.wmtype = DEFAULT_WMTYPE;
      mbmi->interp_filters =
          av1_broadcast_interp_filter(av1_unswitchable_filter(interp_filter));

      memcpy(pts, pts0, total_samples * 2 * sizeof(*pts0));
      memcpy(pts_inref, pts_inref0, total_samples * 2 * sizeof(*pts_inref0));
      // Select the samples according to motion vector difference
      if (mbmi->num_proj_ref > 1) {
        mbmi->num_proj_ref = av1_selectSamples(
            &mbmi->mv[0].as_mv, pts, pts_inref, mbmi->num_proj_ref, bsize);
      }

      // Compute the warped motion parameters with a least squares fit
      //  using the collected samples
      if (!av1_find_projection(mbmi->num_proj_ref, pts, pts_inref, bsize,
                               mbmi->mv[0].as_mv.row, mbmi->mv[0].as_mv.col,
                               &mbmi->wm_params, mi_row, mi_col)) {
        assert(!is_comp_pred);
        if (have_newmv_in_inter_mode(this_mode)) {
          // Refine MV for NEWMV mode
          const int_mv mv0 = mbmi->mv[0];
          const WarpedMotionParams wm_params0 = mbmi->wm_params;
          const int num_proj_ref0 = mbmi->num_proj_ref;

          const int_mv ref_mv = av1_get_ref_mv(x, 0);
          SUBPEL_MOTION_SEARCH_PARAMS ms_params;
          av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize,
                                            &ref_mv.as_mv, NULL);

          // Refine MV in a small range.
          av1_refine_warped_mv(xd, cm, &ms_params, bsize, pts0, pts_inref0,
                               total_samples, cpi->sf.mv_sf.warp_search_method,
                               cpi->sf.mv_sf.warp_search_iters);

          if (mv0.as_int != mbmi->mv[0].as_int) {
            // Keep the refined MV and WM parameters.
            tmp_rate_mv = av1_mv_bit_cost(
                &mbmi->mv[0].as_mv, &ref_mv.as_mv, x->mv_costs->nmv_joint_cost,
                x->mv_costs->mv_cost_stack, MV_COST_WEIGHT);
            tmp_rate2 = rate2_nocoeff - rate_mv0 + tmp_rate_mv;
          } else {
            // Restore the old MV and WM parameters.
            mbmi->mv[0] = mv0;
            mbmi->wm_params = wm_params0;
            mbmi->num_proj_ref = num_proj_ref0;
          }
        }

        // Build the warped predictor
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 0,
                                      av1_num_planes(cm) - 1);
      } else {
        continue;
      }
#endif  // !CONFIG_REALTIME_ONLY
    } else if (is_interintra_mode) {
      const int ret =
          av1_handle_inter_intra_mode(cpi, x, bsize, mbmi, args, ref_best_rd,
                                      &tmp_rate_mv, &tmp_rate2, orig_dst);
      if (ret < 0) continue;
    }

    // If we are searching newmv and the mv is the same as refmv, skip the
    // current mode
    if (!av1_check_newmv_joint_nonzero(cm, x)) continue;

    // Update rd_stats for the current motion mode
    txfm_info->skip_txfm = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
    rd_stats->skip_txfm = 1;
    rd_stats->rate = tmp_rate2;
    const ModeCosts *mode_costs = &x->mode_costs;
    if (mbmi->motion_mode != WARPED_CAUSAL) rd_stats->rate += switchable_rate;
    if (interintra_allowed) {
      rd_stats->rate +=
          mode_costs->interintra_cost[size_group_lookup[bsize]]
                                     [mbmi->ref_frame[1] == INTRA_FRAME];
    }
    if ((last_motion_mode_allowed > SIMPLE_TRANSLATION) &&
        (mbmi->ref_frame[1] != INTRA_FRAME)) {
      if (last_motion_mode_allowed == WARPED_CAUSAL) {
        rd_stats->rate +=
            mode_costs->motion_mode_cost[bsize][mbmi->motion_mode];
      } else {
        rd_stats->rate +=
            mode_costs->motion_mode_cost1[bsize][mbmi->motion_mode];
      }
    }

    int64_t this_yrd = INT64_MAX;

    if (!do_tx_search) {
      // Avoid doing a transform search here to speed up the overall mode
      // search. It will be done later in the mode search if the current
      // motion mode seems promising.
      int64_t curr_sse = -1;
      int64_t sse_y = -1;
      int est_residue_cost = 0;
      int64_t est_dist = 0;
      int64_t est_rd = 0;
      if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1) {
        curr_sse = get_sse(cpi, x, &sse_y);
        const int has_est_rd = get_est_rate_dist(tile_data, bsize, curr_sse,
                                                 &est_residue_cost, &est_dist);
        (void)has_est_rd;
        assert(has_est_rd);
      } else if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 2 ||
                 cpi->sf.rt_sf.use_nonrd_pick_mode) {
        model_rd_sb_fn[MODELRD_TYPE_MOTION_MODE_RD](
            cpi, bsize, x, xd, 0, num_planes - 1, &est_residue_cost, &est_dist,
            NULL, &curr_sse, NULL, NULL, NULL);
        sse_y = x->pred_sse[xd->mi[0]->ref_frame[0]];
      }
      est_rd = RDCOST(x->rdmult, rd_stats->rate + est_residue_cost, est_dist);
      if (est_rd * 0.80 > *best_est_rd) {
        mbmi->ref_frame[1] = ref_frame_1;
        continue;
      }
      const int mode_rate = rd_stats->rate;
      rd_stats->rate += est_residue_cost;
      rd_stats->dist = est_dist;
      rd_stats->rdcost = est_rd;
      if (rd_stats->rdcost < *best_est_rd) {
        *best_est_rd = rd_stats->rdcost;
        assert(sse_y >= 0);
        ref_skip_rd[1] = txfm_rd_gate_level
                             ? RDCOST(x->rdmult, mode_rate, (sse_y << 4))
                             : INT64_MAX;
      }
      if (cm->current_frame.reference_mode == SINGLE_REFERENCE) {
        if (!is_comp_pred) {
          assert(curr_sse >= 0);
          inter_modes_info_push(inter_modes_info, mode_rate, curr_sse,
                                rd_stats->rdcost, rd_stats, rd_stats_y,
                                rd_stats_uv, mbmi);
        }
      } else {
        assert(curr_sse >= 0);
        inter_modes_info_push(inter_modes_info, mode_rate, curr_sse,
                              rd_stats->rdcost, rd_stats, rd_stats_y,
                              rd_stats_uv, mbmi);
      }
      mbmi->skip_txfm = 0;
    } else {
      // Perform full transform search
      int64_t skip_rd = INT64_MAX;
      int64_t skip_rdy = INT64_MAX;
      if (txfm_rd_gate_level) {
        // Check if the mode is good enough based on skip RD
        int64_t sse_y = INT64_MAX;
        int64_t curr_sse = get_sse(cpi, x, &sse_y);
        skip_rd = RDCOST(x->rdmult, rd_stats->rate, curr_sse);
        skip_rdy = RDCOST(x->rdmult, rd_stats->rate, (sse_y << 4));
        int eval_txfm = check_txfm_eval(x, bsize, ref_skip_rd[0], skip_rd,
                                        txfm_rd_gate_level, 0);
        if (!eval_txfm) continue;
      }

      // Do transform search
      const int mode_rate = rd_stats->rate;
      if (!av1_txfm_search(cpi, x, bsize, rd_stats, rd_stats_y, rd_stats_uv,
                           rd_stats->rate, ref_best_rd)) {
        if (rd_stats_y->rate == INT_MAX && mode_index == 0) {
          return INT64_MAX;
        }
        continue;
      }
      const int skip_ctx = av1_get_skip_txfm_context(xd);
      const int y_rate =
          rd_stats->skip_txfm
              ? x->mode_costs.skip_txfm_cost[skip_ctx][1]
              : (rd_stats_y->rate + x->mode_costs.skip_txfm_cost[skip_ctx][0]);
      this_yrd = RDCOST(x->rdmult, y_rate + mode_rate, rd_stats_y->dist);

      const int64_t curr_rd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
      if (curr_rd < ref_best_rd) {
        ref_best_rd = curr_rd;
        ref_skip_rd[0] = skip_rd;
        ref_skip_rd[1] = skip_rdy;
      }
      if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1) {
        inter_mode_data_push(
            tile_data, mbmi->bsize, rd_stats->sse, rd_stats->dist,
            rd_stats_y->rate + rd_stats_uv->rate +
                mode_costs->skip_txfm_cost[skip_ctx][mbmi->skip_txfm]);
      }
    }

    if (this_mode == GLOBALMV || this_mode == GLOBAL_GLOBALMV) {
      if (is_nontrans_global_motion(xd, xd->mi[0])) {
        mbmi->interp_filters =
            av1_broadcast_interp_filter(av1_unswitchable_filter(interp_filter));
      }
    }

    const int64_t tmp_rd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
    if (mode_index == 0) {
      args->simple_rd[this_mode][mbmi->ref_mv_idx][mbmi->ref_frame[0]] = tmp_rd;
    }
    if (mode_index == 0 || tmp_rd < best_rd) {
      // Update best_rd data if this is the best motion mode so far
      best_mbmi = *mbmi;
      best_rd = tmp_rd;
      best_rd_stats = *rd_stats;
      best_rd_stats_y = *rd_stats_y;
      best_rate_mv = tmp_rate_mv;
      *yrd = this_yrd;
      if (num_planes > 1) best_rd_stats_uv = *rd_stats_uv;
      memcpy(best_blk_skip, txfm_info->blk_skip,
             sizeof(txfm_info->blk_skip[0]) * xd->height * xd->width);
      av1_copy_array(best_tx_type_map, xd->tx_type_map, xd->height * xd->width);
      best_xskip_txfm = mbmi->skip_txfm;
    }
  }
  // Update RD and mbmi stats for selected motion mode
  mbmi->ref_frame[1] = ref_frame_1;
  *rate_mv = best_rate_mv;
  if (best_rd == INT64_MAX || !av1_check_newmv_joint_nonzero(cm, x)) {
    av1_invalid_rd_stats(rd_stats);
    restore_dst_buf(xd, *orig_dst, num_planes);
    return INT64_MAX;
  }
  *mbmi = best_mbmi;
  *rd_stats = best_rd_stats;
  *rd_stats_y = best_rd_stats_y;
  if (num_planes > 1) *rd_stats_uv = best_rd_stats_uv;
  memcpy(txfm_info->blk_skip, best_blk_skip,
         sizeof(txfm_info->blk_skip[0]) * xd->height * xd->width);
  av1_copy_array(xd->tx_type_map, best_tx_type_map, xd->height * xd->width);
  txfm_info->skip_txfm = best_xskip_txfm;

  restore_dst_buf(xd, *orig_dst, num_planes);
  return 0;
}